

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_state.cpp
# Opt level: O2

void __thiscall duckdb::TableScanState::~TableScanState(TableScanState *this)

{
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector
            (&(this->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>);
  ScanFilterInfo::~ScanFilterInfo(&this->filters);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->checkpoint_lock).internal.
              super___shared_ptr<duckdb::CheckpointLock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  CollectionScanState::~CollectionScanState(&this->local_state);
  CollectionScanState::~CollectionScanState(&this->table_state);
  return;
}

Assistant:

TableScanState::~TableScanState() {
}